

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

void __thiscall
SolidGlassMaterial::SolidGlassMaterial
          (SolidGlassMaterial *this,float coef,Texture *reflect_color,Texture *refract_color)

{
  Material *in_RDI;
  undefined4 in_XMM0_Da;
  Texture *in_stack_ffffffffffffffb8;
  Texture *this_00;
  
  Material::Material(in_RDI);
  in_RDI->_vptr_Material = (_func_int **)&PTR_shade_003d2948;
  this_00 = (Texture *)(in_RDI + 1);
  Texture::Texture(this_00,in_stack_ffffffffffffffb8);
  Texture::Texture(this_00,in_stack_ffffffffffffffb8);
  *(undefined4 *)&in_RDI[0x1b]._vptr_Material = in_XMM0_Da;
  *(float *)&in_RDI[0x1b]._vptr_Material = 1.0 / *(float *)&in_RDI[0x1b]._vptr_Material;
  return;
}

Assistant:

SolidGlassMaterial(float coef = 1,
		const Texture& reflect_color = Vector3f::ZERO,
		const Texture& refract_color = Vector3f::ZERO) :
		refractCoef(coef),
		reflectColor(reflect_color),refractColor(refract_color) {
		refractCoef = 1 / refractCoef;

//		r0 = (1 - refractCoef) / (1 + refractCoef); r0 *= r0;
	}